

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_clip.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdClipXy::emulate_mthd(MthdClipXy *this)

{
  MthdClipXy *this_local;
  
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
      chipset.card_type < 3) {
    nv01_pgraph_set_clip
              (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0,
               (this->super_SingleMthdTest).super_MthdTest.val);
  }
  else if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
           chipset.card_type < 4) {
    nv03_pgraph_set_clip
              (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,this->which_clip,
               (uint)(this->is_max & 1),(this->super_SingleMthdTest).super_MthdTest.val,
               (long)((ulong)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.orig.
                             xy_misc_1[0] << 0x3f) < 0);
  }
  else {
    nv04_pgraph_set_clip
              (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,this->which_clip,
               (uint)(this->is_max & 1),(this->super_SingleMthdTest).super_MthdTest.val);
  }
  return;
}

Assistant:

void MthdClipXy::emulate_mthd() {
	if (chipset.card_type < 3) {
		nv01_pgraph_set_clip(&exp, 0, val);
	} else if (chipset.card_type < 4) {
		nv03_pgraph_set_clip(&exp, which_clip, is_max, val, extr(orig.xy_misc_1[0], 0, 1));
	} else {
		nv04_pgraph_set_clip(&exp, which_clip, is_max, val);
	}
}